

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

void __thiscall skiwi::Program::~Program(Program *this)

{
  Program *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  ::~map(&this->quotes);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::~vector(&this->expressions);
  return;
}

Assistant:

Program()
      {
      alpha_converted = false;
      assignable_variables_converted = false;
      define_converted = false;
      closure_converted = false;
      cps_converted = false;
      free_variables_analysed = false;
      linear_scan_indices_computed = false;
      simplified_to_core_forms = false;
      single_begin_conversion = false;
      tail_call_analysis = false;
      global_define_env_allocated = false;
      quotes_collected = false;
      quotes_converted = false;      
      quasiquotes_converted = false;
      include_handled = false;
      lambda_to_let_converted = false;
      inline_primitives_converted = false;
      constant_folded = false;
      constant_propagated = false;
      macros_expanded = false;
      single_begins_removed = false;
      }